

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t mtree_atol(char **p,wchar_t base)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  wchar_t local_34;
  wchar_t last_digit_limit;
  wchar_t digit;
  int64_t limit;
  int64_t l;
  wchar_t base_local;
  char **p_local;
  
  l._4_4_ = base;
  if (base == L'\0') {
    if (**p == '0') {
      if (((*p)[1] == 'x') || ((*p)[1] == 'X')) {
        *p = *p + 2;
        l._4_4_ = L'\x10';
      }
      else {
        l._4_4_ = L'\b';
      }
    }
    else {
      l._4_4_ = L'\n';
    }
  }
  if (**p == '-') {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
    lVar6 = SUB168((auVar2 << 0x40 | ZEXT816(0x8000000000000000)) / SEXT816((long)l._4_4_),0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
    *p = *p + 1;
    limit = 0;
    local_34 = parsedigit(**p);
    while (L'\xffffffff' < local_34 && local_34 < l._4_4_) {
      if ((limit < lVar6) ||
         ((limit == lVar6 &&
          (-SUB164((auVar3 << 0x40 | ZEXT816(0x8000000000000000)) % SEXT816((long)l._4_4_),0) <=
           local_34)))) {
        return -0x8000000000000000;
      }
      limit = limit * l._4_4_ - (long)local_34;
      pcVar1 = *p;
      *p = pcVar1 + 1;
      local_34 = parsedigit(pcVar1[1]);
    }
    p_local = (char **)limit;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    lVar6 = SUB168((auVar4 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)l._4_4_),0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    limit = 0;
    local_34 = parsedigit(**p);
    while (L'\xffffffff' < local_34 && local_34 < l._4_4_) {
      if ((lVar6 < limit) ||
         ((limit == lVar6 &&
          (SUB164((auVar5 << 0x40 | ZEXT816(0x7fffffffffffffff)) % SEXT816((long)l._4_4_),0) <
           local_34)))) {
        return 0x7fffffffffffffff;
      }
      limit = limit * l._4_4_ + (long)local_34;
      pcVar1 = *p;
      *p = pcVar1 + 1;
      local_34 = parsedigit(pcVar1[1]);
    }
    p_local = (char **)limit;
  }
  return (int64_t)p_local;
}

Assistant:

static int64_t
mtree_atol(char **p, int base)
{
	int64_t l, limit;
	int digit, last_digit_limit;

	if (base == 0) {
		if (**p != '0')
			base = 10;
		else if ((*p)[1] == 'x' || (*p)[1] == 'X') {
			*p += 2;
			base = 16;
		} else {
			base = 8;
		}
	}

	if (**p == '-') {
		limit = INT64_MIN / base;
		last_digit_limit = -(INT64_MIN % base);
		++(*p);

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l < limit || (l == limit && digit >= last_digit_limit))
				return INT64_MIN;
			l = (l * base) - digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	} else {
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l > limit || (l == limit && digit > last_digit_limit))
				return INT64_MAX;
			l = (l * base) + digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	}
}